

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O3

RuleBasedCollator * __thiscall
icu_63::RuleBasedNumberFormat::getCollator(RuleBasedNumberFormat *this)

{
  short sVar1;
  Collator *pCVar2;
  RuleBasedCollator *this_00;
  UnicodeString *pUVar3;
  int32_t srcLength;
  UErrorCode status;
  UnicodeString rules;
  UErrorCode local_5c;
  UnicodeString local_58;
  
  if (this->fRuleSets == (NFRuleSet **)0x0) {
    return (RuleBasedCollator *)0x0;
  }
  if (this->collator != (RuleBasedCollator *)0x0) {
    return this->collator;
  }
  if (this->lenient == '\0') {
    return (RuleBasedCollator *)0x0;
  }
  local_5c = U_ZERO_ERROR;
  pCVar2 = Collator::createInstance(&this->locale,&local_5c);
  if (local_5c < U_ILLEGAL_ARGUMENT_ERROR) {
    if (pCVar2 == (Collator *)0x0) goto LAB_0021f5d3;
    this_00 = (RuleBasedCollator *)
              __dynamic_cast(pCVar2,&Collator::typeinfo,&RuleBasedCollator::typeinfo,0);
    if (this_00 != (RuleBasedCollator *)0x0) {
      if (this->lenientParseRules == (UnicodeString *)0x0) {
        pCVar2 = (Collator *)0x0;
      }
      else {
        pUVar3 = RuleBasedCollator::getRules(this_00);
        UnicodeString::UnicodeString(&local_58,pUVar3);
        pUVar3 = this->lenientParseRules;
        sVar1 = (pUVar3->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          srcLength = (pUVar3->fUnion).fFields.fLength;
        }
        else {
          srcLength = (int)sVar1 >> 5;
        }
        UnicodeString::doAppend(&local_58,pUVar3,0,srcLength);
        this_00 = (RuleBasedCollator *)UMemory::operator_new((UMemory *)0x110,(size_t)pUVar3);
        if (this_00 == (RuleBasedCollator *)0x0) {
          UnicodeString::~UnicodeString(&local_58);
          return (RuleBasedCollator *)0x0;
        }
        RuleBasedCollator::RuleBasedCollator(this_00,&local_58,&local_5c);
        UnicodeString::~UnicodeString(&local_58);
        if (U_ZERO_ERROR < local_5c) {
          (*(this_00->super_Collator).super_UObject._vptr_UObject[1])(this_00);
          goto LAB_0021f56c;
        }
      }
      (*(this_00->super_Collator).super_UObject._vptr_UObject[0x17])(this_00,4,0x11,&local_5c);
      this->collator = this_00;
      goto LAB_0021f567;
    }
  }
  else {
LAB_0021f567:
    if (pCVar2 == (Collator *)0x0) goto LAB_0021f5d3;
  }
LAB_0021f56c:
  (*(pCVar2->super_UObject)._vptr_UObject[1])(pCVar2);
LAB_0021f5d3:
  return this->collator;
}

Assistant:

const RuleBasedCollator*
RuleBasedNumberFormat::getCollator() const
{
#if !UCONFIG_NO_COLLATION
    if (!fRuleSets) {
        return NULL;
    }

    // lazy-evaluate the collator
    if (collator == NULL && lenient) {
        // create a default collator based on the formatter's locale,
        // then pull out that collator's rules, append any additional
        // rules specified in the description, and create a _new_
        // collator based on the combination of those rules

        UErrorCode status = U_ZERO_ERROR;

        Collator* temp = Collator::createInstance(locale, status);
        RuleBasedCollator* newCollator;
        if (U_SUCCESS(status) && (newCollator = dynamic_cast<RuleBasedCollator*>(temp)) != NULL) {
            if (lenientParseRules) {
                UnicodeString rules(newCollator->getRules());
                rules.append(*lenientParseRules);

                newCollator = new RuleBasedCollator(rules, status);
                // Exit if newCollator could not be created.
                if (newCollator == NULL) {
                    return NULL;
                }
            } else {
                temp = NULL;
            }
            if (U_SUCCESS(status)) {
                newCollator->setAttribute(UCOL_DECOMPOSITION_MODE, UCOL_ON, status);
                // cast away const
                ((RuleBasedNumberFormat*)this)->collator = newCollator;
            } else {
                delete newCollator;
            }
        }
        delete temp;
    }
#endif

    // if lenient-parse mode is off, this will be null
    // (see setLenientParseMode())
    return collator;
}